

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O3

ProgramCacheResult __thiscall
QRhiGles2::tryLoadFromDiskOrPipelineCache
          (QRhiGles2 *this,QRhiShaderStage *stages,int stageCount,GLuint program,
          QVector<QShaderDescription::InOutVariable> *inputVars,QByteArray *cacheKey)

{
  QRhiShaderStage *shaderStage;
  byte bVar1;
  Data *pDVar2;
  long lVar3;
  qsizetype qVar4;
  Span *pSVar5;
  Entry *pEVar6;
  int *piVar7;
  Data *pDVar8;
  bool bVar9;
  int iVar10;
  _Rb_tree_node_base *p_Var11;
  QOpenGLProgramBinaryCache *this_00;
  QLoggingCategory *pQVar12;
  Type TVar13;
  char *pcVar14;
  undefined8 *puVar15;
  QArrayData *pQVar16;
  QArrayData *this_01;
  ulong uVar17;
  InOutVariable *var;
  InOutVariable *key;
  InOutVariable *pIVar18;
  _Rb_tree_node_base *p_Var19;
  ProgramCacheResult PVar20;
  long in_FS_OFFSET;
  bool bVar21;
  const_iterator cVar22;
  GLint linkStatus;
  undefined1 local_a8 [4];
  QFlagsStorage<QArrayData::ArrayOption> QStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined4 local_98;
  undefined4 uStack_94;
  char *local_90;
  QMap<QByteArray,_int> local_80;
  QByteArray local_78;
  QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar9 = isProgramBinaryDiskCacheEnabled(this);
  if ((((this->caps).field_0x3b & 0x40) == 0) ||
     (pDVar2 = (this->m_pipelineCache).d, pDVar2 == (Data *)0x0)) {
    bVar21 = false;
  }
  else {
    bVar21 = pDVar2->size != 0;
  }
  PVar20 = ProgramCacheMiss;
  if ((bVar9 | bVar21) != 1) goto LAB_0056fbcd;
  local_58.d = (Data *)0x0;
  local_58.ptr = (ShaderDesc *)0x0;
  local_58.size = 0;
  if (0 < stageCount) {
    uVar17 = 0;
    do {
      shaderStage = stages + uVar17;
      local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_78.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
      shaderSource(&local_78,this,shaderStage,(QShaderVersion *)0x0);
      if ((char *)local_78.d.size == (char *)0x0) {
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,1,0x10);
          }
        }
        PVar20 = ProgramCacheError;
        goto LAB_0056fbc0;
      }
      TVar13 = shaderStage->m_type;
      if (TVar13 == Vertex) {
        local_80.d.d.ptr =
             (QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_int,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_int>_>_>_>_>
              )(totally_ordered_wrapper<QMapData<std::map<QByteArray,_int,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_int>_>_>_>_*>
                )0x0;
        lVar3 = (inputVars->d).size;
        if (lVar3 != 0) {
          key = (inputVars->d).ptr;
          pIVar18 = key + lVar3;
          do {
            QMap<QByteArray,_int>::insert(&local_80,&key->name,&key->location);
            key = key + 1;
          } while (key != pIVar18);
        }
        local_a8 = (undefined1  [4])0x0;
        QStack_a4.i = 0;
        uStack_a0 = 0x6b7187;
        uStack_9c = 0;
        local_98 = 5;
        uStack_94 = 0;
        QByteArray::append(&local_78);
        piVar7 = (int *)CONCAT44(QStack_a4.i,local_a8);
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            QArrayData::deallocate((QArrayData *)CONCAT44(QStack_a4.i,local_a8),1,0x10);
          }
        }
        if (local_80.d.d.ptr ==
            (totally_ordered_wrapper<QMapData<std::map<QByteArray,_int,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_int>_>_>_>_*>
             )0x0) {
          p_Var11 = (_Rb_tree_node_base *)0x0;
        }
        else {
          p_Var11 = *(_Base_ptr *)((long)local_80.d.d.ptr + 0x20);
        }
        p_Var19 = (_Rb_tree_node_base *)((long)local_80.d.d.ptr + 0x10);
        if (local_80.d.d.ptr ==
            (totally_ordered_wrapper<QMapData<std::map<QByteArray,_int,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_int>_>_>_>_*>
             )0x0) {
          p_Var19 = (_Rb_tree_node_base *)0x0;
        }
        for (; p_Var11 != p_Var19; p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11))
        {
          QByteArray::append(&local_78);
          QByteArray::number((int)(ShaderDesc *)local_a8,*(int *)&p_Var11[1]._M_right);
          QByteArray::append(&local_78);
          piVar7 = (int *)CONCAT44(QStack_a4.i,local_a8);
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              QArrayData::deallocate((QArrayData *)CONCAT44(QStack_a4.i,local_a8),1,0x10);
            }
          }
        }
        local_a8 = (undefined1  [4])0x0;
        QStack_a4.i = 0;
        uStack_a0 = 0x678170;
        uStack_9c = 0;
        local_98 = 1;
        uStack_94 = 0;
        QByteArray::append(&local_78);
        piVar7 = (int *)CONCAT44(QStack_a4.i,local_a8);
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            QArrayData::deallocate((QArrayData *)CONCAT44(QStack_a4.i,local_a8),1,0x10);
          }
        }
        QtPrivate::
        QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_int,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_int>_>_>_>_>
        ::~QExplicitlySharedDataPointerV2(&local_80.d);
        TVar13 = shaderStage->m_type;
      }
      uStack_a0 = SUB84(local_78.d.d,0);
      uStack_9c = (undefined4)((ulong)local_78.d.d >> 0x20);
      local_98 = SUB84(local_78.d.ptr,0);
      uStack_94 = (undefined4)((ulong)local_78.d.ptr >> 0x20);
      local_90 = (char *)local_78.d.size;
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_a8 = (undefined1  [4])TVar13;
      QtPrivate::QGenericArrayOps<QOpenGLProgramBinaryCache::ShaderDesc>::
      emplace<QOpenGLProgramBinaryCache::ShaderDesc>
                ((QGenericArrayOps<QOpenGLProgramBinaryCache::ShaderDesc> *)&local_58,local_58.size,
                 (ShaderDesc *)local_a8);
      QList<QOpenGLProgramBinaryCache::ShaderDesc>::end
                ((QList<QOpenGLProgramBinaryCache::ShaderDesc> *)&local_58);
      piVar7 = (int *)CONCAT44(uStack_9c,uStack_a0);
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if (*piVar7 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(uStack_9c,uStack_a0),1,0x10);
        }
      }
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,1,0x10);
        }
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 != (uint)stageCount);
  }
  this_01 = (QArrayData *)local_a8;
  QOpenGLProgramBinaryCache::ProgramDesc::cacheKey((QByteArray *)this_01,(ProgramDesc *)&local_58);
  pQVar16 = &((cacheKey->d).d)->super_QArrayData;
  pcVar14 = (cacheKey->d).ptr;
  pDVar8 = (Data *)CONCAT44(QStack_a4.i,local_a8);
  local_a8 = SUB84(pQVar16,0);
  QStack_a4.i = (Int)((ulong)pQVar16 >> 0x20);
  (cacheKey->d).d = pDVar8;
  (cacheKey->d).ptr = (char *)CONCAT44(uStack_9c,uStack_a0);
  uStack_a0 = SUB84(pcVar14,0);
  uStack_9c = (undefined4)((ulong)pcVar14 >> 0x20);
  qVar4 = (cacheKey->d).size;
  (cacheKey->d).size = CONCAT44(uStack_94,local_98);
  local_98 = (undefined4)qVar4;
  uStack_94 = (undefined4)((ulong)qVar4 >> 0x20);
  if (pQVar16 != (QArrayData *)0x0) {
    LOCK();
    (pQVar16->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar16->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar16->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar16,1,0x10);
      this_01 = pQVar16;
    }
  }
  if (bVar21 == false) {
LAB_0056fb04:
    if (bVar9) {
      this_00 = (QOpenGLProgramBinaryCache *)
                QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qrhi_programBinaryCache>_>
                ::operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qrhi_programBinaryCache>_>
                              *)this_01);
      bVar9 = QOpenGLProgramBinaryCache::load(this_00,cacheKey,program);
      if (bVar9) {
        pQVar12 = QtPrivateLogging::lcOpenGLProgramDiskCache();
        if (((pQVar12->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) == 0)
        goto LAB_0056fbbd;
        local_90 = pQVar12->name;
        local_a8 = (undefined1  [4])0x2;
        QStack_a4.i = 0;
        uStack_a0 = 0;
        uStack_9c = 0;
        local_98 = 0;
        uStack_94 = 0;
        pcVar14 = (cacheKey->d).ptr;
        if (pcVar14 == (char *)0x0) {
          pcVar14 = (char *)&QByteArray::_empty;
        }
        PVar20 = ProgramCacheHit;
        QMessageLogger::debug
                  (local_a8,"Program binary received from cache, program %u, key %s",(ulong)program,
                   pcVar14);
        goto LAB_0056fbc0;
      }
    }
    QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc>::~QArrayDataPointer(&local_58);
    PVar20 = ProgramCacheMiss;
  }
  else {
    this_01 = (QArrayData *)&this->m_pipelineCache;
    cVar22 = QHash<QByteArray,_QRhiGles2::PipelineCacheData>::constFindImpl<QByteArray>
                       ((QHash<QByteArray,_QRhiGles2::PipelineCacheData> *)this_01,cacheKey);
    if (cVar22.i.d == (Data<QHashPrivate::Node<QByteArray,_QRhiGles2::PipelineCacheData>_> *)0x0 &&
        cVar22.i.bucket == 0) goto LAB_0056fb04;
    do {
      iVar10 = (*(((this->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).
                 functions[0x17])();
      if (iVar10 == 0x507) break;
    } while (iVar10 != 0);
    pSVar5 = (cVar22.i.d)->spans;
    uVar17 = cVar22.i.bucket >> 7;
    pEVar6 = pSVar5[uVar17].entries;
    bVar1 = pSVar5[uVar17].offsets[(uint)cVar22.i.bucket & 0x7f];
    puVar15 = *(undefined8 **)(pEVar6[bVar1].storage.data + 0x28);
    if (puVar15 == (undefined8 *)0x0) {
      puVar15 = &QByteArray::_empty;
    }
    this_01 = (QArrayData *)(ulong)program;
    (*(this->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr[1].field_0.functions[0x61]
    )(this_01,(ulong)*(uint *)(pEVar6[bVar1].storage.data + 0x18),puVar15,
      (ulong)*(uint *)(pEVar6[bVar1].storage.data + 0x30));
    iVar10 = (*(((this->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).
               functions[0x17])();
    if (iVar10 != 0) goto LAB_0056fb04;
    local_a8 = (undefined1  [4])0x0;
    this_01 = (QArrayData *)(ulong)program;
    (*(((this->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).functions
      [0x55])(this_01,0x8b82,local_a8);
    if (local_a8 != (undefined1  [4])0x1) goto LAB_0056fb04;
LAB_0056fbbd:
    PVar20 = ProgramCacheHit;
LAB_0056fbc0:
    QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc>::~QArrayDataPointer(&local_58);
  }
LAB_0056fbcd:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return PVar20;
  }
  __stack_chk_fail();
}

Assistant:

QRhiGles2::ProgramCacheResult QRhiGles2::tryLoadFromDiskOrPipelineCache(const QRhiShaderStage *stages,
                                                                        int stageCount,
                                                                        GLuint program,
                                                                        const QVector<QShaderDescription::InOutVariable> &inputVars,
                                                                        QByteArray *cacheKey)
{
    Q_ASSERT(cacheKey);

    // the traditional QOpenGL disk cache since Qt 5.9
    const bool legacyDiskCacheEnabled = isProgramBinaryDiskCacheEnabled();

    // QRhi's own (set)PipelineCacheData()
    const bool pipelineCacheEnabled = caps.programBinary && !m_pipelineCache.isEmpty();

    // calculating the cache key based on the source code is common for both types of caches
    if (legacyDiskCacheEnabled || pipelineCacheEnabled) {
        QOpenGLProgramBinaryCache::ProgramDesc binaryProgram;
        for (int i = 0; i < stageCount; ++i) {
            const QRhiShaderStage &stage(stages[i]);
            QByteArray source = shaderSource(stage, nullptr);
            if (source.isEmpty())
                return QRhiGles2::ProgramCacheError;

            if (stage.type() == QRhiShaderStage::Vertex) {
                // Now add something to the key that indicates the vertex input locations.
                // A GLSL shader lower than 330 (150, 140, ...) will not have location
                // qualifiers. This means that the shader source code is the same
                // regardless of what locations inputVars contains. This becomes a problem
                // because we'll glBindAttribLocation the shader based on inputVars, but
                // that's only when compiling/linking when there was no cache hit. Picking
                // from the cache afterwards should take the input locations into account
                // since if inputVars has now different locations for the attributes, then
                // it is not ok to reuse a program binary that used different attribute
                // locations. For a lot of clients this would not be an issue since they
                // typically hardcode and use the same vertex locations on every run. Some
                // systems that dynamically generate shaders may end up with a non-stable
                // order (and so location numbers), however. This is sub-optimal because
                // it makes caching inefficient, and said clients should be fixed, but in
                // any case this should not break rendering. Hence including the locations
                // in the cache key.
                QMap<QByteArray, int> inputLocations; // sorted by key when iterating
                for (const QShaderDescription::InOutVariable &var : inputVars)
                    inputLocations.insert(var.name, var.location);
                source += QByteArrayLiteral("\n // "); // just to be nice; treated as an arbitrary string regardless
                for (auto it = inputLocations.cbegin(), end = inputLocations.cend(); it != end; ++it) {
                    source += it.key();
                    source += QByteArray::number(it.value());
                }
                source += QByteArrayLiteral("\n");
            }

            binaryProgram.shaders.append(QOpenGLProgramBinaryCache::ShaderDesc(toShaderStage(stage.type()), source));
        }

        *cacheKey = binaryProgram.cacheKey();

        // Try our pipeline cache simulation first, if it got seeded with
        // setPipelineCacheData and there's a hit, then no need to go to the
        // filesystem at all.
        if (pipelineCacheEnabled) {
            auto it = m_pipelineCache.constFind(*cacheKey);
            if (it != m_pipelineCache.constEnd()) {
                GLenum err;
                for ( ; ; ) {
                    err = f->glGetError();
                    if (err == GL_NO_ERROR || err == GL_CONTEXT_LOST)
                        break;
                }
                f->glProgramBinary(program, it->format, it->data.constData(), it->data.size());
                err = f->glGetError();
                if (err == GL_NO_ERROR) {
                    GLint linkStatus = 0;
                    f->glGetProgramiv(program, GL_LINK_STATUS, &linkStatus);
                    if (linkStatus == GL_TRUE)
                        return QRhiGles2::ProgramCacheHit;
                }
            }
        }

        if (legacyDiskCacheEnabled && qrhi_programBinaryCache()->load(*cacheKey, program)) {
            // use the logging category QOpenGLShaderProgram would
            qCDebug(lcOpenGLProgramDiskCache, "Program binary received from cache, program %u, key %s",
                    program, cacheKey->constData());
            return QRhiGles2::ProgramCacheHit;
        }
    }

    return QRhiGles2::ProgramCacheMiss;
}